

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_pushfstring(lua_State *L,char *fmt,...)

{
  char *pcVar1;
  lua_State *in_RDX;
  long in_RDI;
  __va_list_tag *in_stack_00000048;
  char *in_stack_00000050;
  lua_State *in_stack_00000058;
  va_list argp;
  char *ret;
  
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
    lj_gc_step(in_RDX);
  }
  pcVar1 = lj_strfmt_pushvf(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return pcVar1;
}

Assistant:

LUA_API const char *lua_pushfstring(lua_State *L, const char *fmt, ...)
{
  const char *ret;
  va_list argp;
  lj_gc_check(L);
  va_start(argp, fmt);
  ret = lj_strfmt_pushvf(L, fmt, argp);
  va_end(argp);
  return ret;
}